

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::checkIsInMessageFixture::checkIsInMessageFixture
          (checkIsInMessageFixture *this)

{
  allocator<char> local_31;
  string local_30;
  
  FIX::DataDictionary::DataDictionary(&this->object);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FIX.4.0",&local_31);
  FIX::DataDictionary::setVersion(&this->object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  FIX::DataDictionary::addField(&this->object,8);
  FIX::DataDictionary::addField(&this->object,9);
  FIX::DataDictionary::addField(&this->object,0x23);
  FIX::DataDictionary::addField(&this->object,10);
  FIX::DataDictionary::addField(&this->object,0x70);
  FIX::DataDictionary::addField(&this->object,0x37);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1",&local_31);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->field_0xd0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"1",&local_31);
  FIX::DataDictionary::addMsgField(&this->object,&local_30,0x70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

checkIsInMessageFixture()
  {
    object.setVersion( BeginString_FIX40 );
    object.addField( FIELD::BeginString );
    object.addField( FIELD::BodyLength );
    object.addField( FIELD::MsgType );
    object.addField( FIELD::CheckSum );
    object.addField( FIELD::TestReqID );
    object.addField( FIELD::Symbol );
    object.addMsgType( MsgType_TestRequest );
    object.addMsgField( MsgType_TestRequest, FIELD::TestReqID );
  }